

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

void ly_err_free(void *ptr)

{
  ly_err_item *plVar1;
  ly_err_item *next;
  ly_err_item *e;
  void *ptr_local;
  
  next = (ly_err_item *)ptr;
  while (next != (ly_err_item *)0x0) {
    plVar1 = next->next;
    free(next->msg);
    free(next->data_path);
    free(next->schema_path);
    free(next->apptag);
    free(next);
    next = plVar1;
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
ly_err_free(void *ptr)
{
    struct ly_err_item *e, *next;

    /* clean the error list */
    LY_LIST_FOR_SAFE(ptr, next, e) {
        free(e->msg);
        free(e->data_path);
        free(e->schema_path);
        free(e->apptag);
        free(e);
    }
}